

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_everything_together.cxx
# Opt level: O3

void __thiscall simple_state_mgr::~simple_state_mgr(simple_state_mgr *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_state_mgr)._vptr_state_mgr = (_func_int **)&PTR__simple_state_mgr_00176978;
  pcVar2 = (this->store_path_)._M_dataplus._M_p;
  paVar1 = &(this->store_path_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  ::~vector(&this->cluster_);
  operator_delete(this,0x48);
  return;
}

Assistant:

simple_state_mgr(int32 srv_id, const std::vector<ptr<srv_config>>& cluster) : srv_id_(srv_id), cluster_(cluster)
    {
        store_path_ = sstrfmt("store%d").fmt(srv_id_);
    }